

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

void mcbsp_hpput(mcbsp_pid_t pid,void *src,void *dst,mcbsp_size_t offset,mcbsp_size_t size)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  mcbsp_pid_t mVar4;
  Memslot slot;
  Memblock *pMVar5;
  char *d;
  Memblock dst_slot;
  Memslot dst_slot_id;
  mcbsp_size_t size_local;
  mcbsp_size_t offset_local;
  void *dst_local;
  void *src_local;
  mcbsp_pid_t pid_local;
  
  if ((s_spmd == (Spmd *)0x0) || (bVar2 = bsplib::Spmd::closed(s_spmd), bVar2)) {
    bsp_abort("bsp_put: can only be called within SPMD section\n");
  }
  if (size != 0) {
    uVar3 = bsplib::Spmd::nprocs(s_spmd);
    if (uVar3 < pid) {
      bsp_abort("bsp_hpput: The destination process ID does not exist\n");
    }
    if (dst == (void *)0x0) {
      bsp_abort("bsp_hpput: Destination address cannot be identified by NULL\n");
    }
    slot = lookup_usable_reg(dst,"bsp_hpput");
    pMVar5 = bsplib::Rdma::slot(s_rdma,pid,slot);
    uVar1 = pMVar5->size;
    if (uVar1 < offset + size) {
      bsp_abort("bsp_hpput: Writes %zu bytes beyond registered range [%p,%p+%zu) at process %d\n",
                (offset + size) - uVar1,pMVar5->addr,pMVar5->addr,uVar1,(ulong)pid);
    }
    mVar4 = bsplib::Spmd::pid(s_spmd);
    if (pid == mVar4) {
      memcpy((void *)((long)dst + offset),src,size);
    }
    else {
      bsplib::Rdma::hpput(s_rdma,src,pid,slot,offset,size);
    }
  }
  return;
}

Assistant:

void mcbsp_hpput( mcbsp_pid_t pid, const void * src,
             const void * dst, mcbsp_size_t offset, mcbsp_size_t size )
{
#ifdef PROFILE
    TicToc t( TicToc::HPPUT, size );
#endif

    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_put: can only be called within SPMD section\n");

    if (size == 0) // ignore any empty writes
        return;

    if (pid > mcbsp_pid_t(s_spmd->nprocs()))
        bsp_abort("bsp_hpput: The destination process ID does not exist\n");
    if ( dst == NULL )
        bsp_abort("bsp_hpput: Destination address cannot be identified by NULL\n");

    bsplib::Rdma::Memslot dst_slot_id = lookup_usable_reg( dst, "bsp_hpput" );
    bsplib::Rdma::Memblock dst_slot = s_rdma->slot( pid, dst_slot_id );

    if ( size_t(offset + size ) > dst_slot.size )
        bsp_abort("bsp_hpput: Writes %zu bytes beyond registered "
                  "range [%p,%p+%zu) at process %d\n",
                  offset + size - dst_slot.size,
                  dst_slot.addr, dst_slot.addr, dst_slot.size, pid );

    if (pid == mcbsp_pid_t(s_spmd->pid()) )
    {
        char * d = static_cast<char *>(const_cast<void *>(dst));
        std::memcpy(d + offset, src, size );
    }
    else
    {
        s_rdma->hpput( src, pid, dst_slot_id, offset, size );
    }
}